

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O2

void __thiscall
VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>::
Ser<AutoFile,std::vector<double,std::allocator<double>>>
          (VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter> *this,AutoFile *s,
          vector<double,_std::allocator<double>_> *v)

{
  long lVar1;
  FILE *pFVar2;
  AutoFile *s_00;
  value_type_conflict7 *elem;
  FILE *pFVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  s_00 = (AutoFile *)
         ((long)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start - (long)s->m_file >> 3);
  WriteCompactSize<AutoFile>((AutoFile *)this,(uint64_t)s_00);
  pFVar2 = (FILE *)(s->m_xor).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                   super__Vector_impl_data._M_start;
  for (pFVar3 = s->m_file; pFVar3 != pFVar2; pFVar3 = (FILE *)&pFVar3->_IO_read_ptr) {
    anon_unknown.dwarf_5d8e78::EncodedDoubleFormatter::Ser<AutoFile>
              ((EncodedDoubleFormatter *)this,s_00,*(double *)pFVar3);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Ser(Stream& s, const V& v)
    {
        Formatter formatter;
        WriteCompactSize(s, v.size());
        for (const typename V::value_type& elem : v) {
            formatter.Ser(s, elem);
        }
    }